

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_cvt.hpp
# Opt level: O0

void cvt_generic_to_FMIns<ADL_Instrument>(OplInstMeta *ins,ADL_Instrument *in)

{
  byte bVar1;
  bool bVar2;
  long local_30;
  size_t slt;
  size_t op;
  int voice2_fine_tune;
  ADL_Instrument *in_local;
  OplInstMeta *ins_local;
  
  ins->voice2_fine_tune = 0.0;
  if (in->second_voice_detune != 0) {
    ins->voice2_fine_tune = (double)((in->second_voice_detune + 0x80 >> 1) + -0x40) / 32.0;
  }
  ins->midiVelocityOffset = in->midi_velocity_offset;
  ins->drumTone = in->percussion_key_number;
  bVar2 = false;
  if ((in->inst_flags & 1) != 0) {
    bVar2 = (in->inst_flags & 2) != 0;
  }
  ins->flags = bVar2;
  bVar2 = false;
  if ((in->inst_flags & 1) != 0) {
    bVar2 = (in->inst_flags & 2) == 0;
  }
  bVar1 = 0;
  if (bVar2) {
    bVar1 = 4;
  }
  ins->flags = ins->flags | bVar1;
  bVar1 = 0;
  if ((in->inst_flags & 4) != 0) {
    bVar1 = 2;
  }
  ins->flags = ins->flags | bVar1;
  ins->flags = ins->flags | in->inst_flags & 0x38;
  local_30 = 0;
  for (slt = 0; slt < 4; slt = slt + 2) {
    ins->op[local_30].carrier_E862 =
         (uint)in->operators[slt].waveform_E0 << 0x18 | (uint)in->operators[slt].susrel_80 << 0x10 |
         (uint)in->operators[slt].atdec_60 << 8 | (uint)in->operators[slt].avekf_20;
    ins->op[local_30].carrier_40 = in->operators[slt].ksl_l_40;
    ins->op[local_30].modulator_E862 =
         (uint)in->operators[slt + 1].waveform_E0 << 0x18 |
         (uint)in->operators[slt + 1].susrel_80 << 0x10 | (uint)in->operators[slt + 1].atdec_60 << 8
         | (uint)in->operators[slt + 1].avekf_20;
    ins->op[local_30].modulator_40 = in->operators[slt + 1].ksl_l_40;
    local_30 = local_30 + 1;
  }
  ins->op[0].noteOffset = (int8_t)in->note_offset1;
  ins->op[0].feedconn = in->fb_conn1_C0;
  ins->op[1].noteOffset = (int8_t)in->note_offset2;
  ins->op[1].feedconn = in->fb_conn2_C0;
  ins->soundKeyOnMs = in->delay_on_ms;
  ins->soundKeyOffMs = in->delay_off_ms;
  return;
}

Assistant:

static void cvt_generic_to_FMIns(OplInstMeta &ins, const WOPLI &in)
{
    ins.voice2_fine_tune = 0.0;
    int voice2_fine_tune = in.second_voice_detune;

    if(voice2_fine_tune != 0)
    {
        // Simulate behavior of DMX second voice detune
        ins.voice2_fine_tune = (double)(((voice2_fine_tune + 128) >> 1) - 64) / 32.0;
    }

    ins.midiVelocityOffset = in.midi_velocity_offset;
    ins.drumTone = in.percussion_key_number;
    ins.flags = (in.inst_flags & WOPL_Ins_4op) && (in.inst_flags & WOPL_Ins_Pseudo4op) ? OplInstMeta::Flag_Pseudo4op : 0;
    ins.flags|= (in.inst_flags & WOPL_Ins_4op) && ((in.inst_flags & WOPL_Ins_Pseudo4op) == 0) ? OplInstMeta::Flag_Real4op : 0;
    ins.flags|= (in.inst_flags & WOPL_Ins_IsBlank) ? OplInstMeta::Flag_NoSound : 0;
    ins.flags|= in.inst_flags & WOPL_RhythmModeMask;

    for(size_t op = 0, slt = 0; op < 4; op++, slt++)
    {
        ins.op[slt].carrier_E862 =
            ((static_cast<uint32_t>(in.operators[op].waveform_E0) << 24) & 0xFF000000) //WaveForm
            | ((static_cast<uint32_t>(in.operators[op].susrel_80) << 16) & 0x00FF0000) //SusRel
            | ((static_cast<uint32_t>(in.operators[op].atdec_60) << 8) & 0x0000FF00)   //AtDec
            | ((static_cast<uint32_t>(in.operators[op].avekf_20) << 0) & 0x000000FF);  //AVEKM
        ins.op[slt].carrier_40 = in.operators[op].ksl_l_40;//KSLL

        op++;
        ins.op[slt].modulator_E862 =
            ((static_cast<uint32_t>(in.operators[op].waveform_E0) << 24) & 0xFF000000) //WaveForm
            | ((static_cast<uint32_t>(in.operators[op].susrel_80) << 16) & 0x00FF0000) //SusRel
            | ((static_cast<uint32_t>(in.operators[op].atdec_60) << 8) & 0x0000FF00)   //AtDec
            | ((static_cast<uint32_t>(in.operators[op].avekf_20) << 0) & 0x000000FF);  //AVEKM
        ins.op[slt].modulator_40 = in.operators[op].ksl_l_40;//KSLL
    }

    ins.op[0].noteOffset = static_cast<int8_t>(in.note_offset1);
    ins.op[0].feedconn = in.fb_conn1_C0;
    ins.op[1].noteOffset = static_cast<int8_t>(in.note_offset2);
    ins.op[1].feedconn = in.fb_conn2_C0;

    ins.soundKeyOnMs  = in.delay_on_ms;
    ins.soundKeyOffMs = in.delay_off_ms;
}